

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,tagbstring *x)

{
  uint uVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint len;
  CBStringException bstr__cppwrapper_exception;
  CBStringException CStack_98;
  string local_70;
  string local_50;
  string local_30;
  
  uVar1 = (this->super_tagbstring).mlen;
  if ((int)uVar1 < 1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_98,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_98);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = x->slen;
  if (-1 < (int)len) {
    if (uVar1 <= len) {
      alloc(this,len);
      len = x->slen;
    }
    (this->super_tagbstring).slen = len;
    __dest = (this->super_tagbstring).data;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,x->data,(long)(int)len);
      (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
      return this;
    }
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CBString::Failure in =(tagbstring) operator","");
    CBStringException::CBStringException(&CStack_98,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&CStack_98);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "CBString::Failure in =(tagbstring) operator, badly formed tagbstring","");
  CBStringException::CBStringException(&CStack_98,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&CStack_98);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const tagbstring& x) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (x.slen < 0) bstringThrow ("Failure in =(tagbstring) operator, badly formed tagbstring");
	if (x.slen >= mlen) alloc (x.slen);

	slen = x.slen;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(tagbstring) operator");
	} else {
		bstr__memcpy (data, x.data, slen);
		data[slen] = '\0';
	}
	return *this;
}